

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall deqp::gls::DrawTest::~DrawTest(DrawTest *this)

{
  DrawTest *this_local;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__DrawTest_032e6d30;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[3])();
  tcu::ResultCollector::~ResultCollector(&this->m_result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_iteration_descriptions);
  std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::~vector
            (&this->m_specs);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

DrawTest::~DrawTest	(void)
{
	deinit();
}